

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSNode.h
# Opt level: O0

char * dg::pta::PSNodeTypeToCString(PSNodeType type)

{
  PSNodeType type_local;
  char *local_8;
  
  switch(type) {
  case ALLOC:
    local_8 = "PSNodeType::ALLOC";
    break;
  case LOAD:
    local_8 = "PSNodeType::LOAD";
    break;
  case STORE:
    local_8 = "PSNodeType::STORE";
    break;
  case GEP:
    local_8 = "PSNodeType::GEP";
    break;
  case PHI:
    local_8 = "PSNodeType::PHI";
    break;
  case CAST:
    local_8 = "PSNodeType::CAST";
    break;
  case FUNCTION:
    local_8 = "PSNodeType::FUNCTION";
    break;
  case CALL:
    local_8 = "PSNodeType::CALL";
    break;
  case CALL_FUNCPTR:
    local_8 = "PSNodeType::CALL_FUNCPTR";
    break;
  case CALL_RETURN:
    local_8 = "PSNodeType::CALL_RETURN";
    break;
  case ENTRY:
    local_8 = "PSNodeType::ENTRY";
    break;
  case RETURN:
    local_8 = "PSNodeType::RETURN";
    break;
  case FORK:
    local_8 = "PSNodeType::FORK";
    break;
  case JOIN:
    local_8 = "PSNodeType::JOIN";
    break;
  case INVALIDATE_LOCALS:
    local_8 = "PSNodeType::INVALIDATE_LOCALS";
    break;
  case FREE:
    local_8 = "PSNodeType::FREE";
    break;
  case INVALIDATE_OBJECT:
    local_8 = "PSNodeType::INVALIDATE_OBJECT";
    break;
  case CONSTANT:
    local_8 = "PSNodeType::CONSTANT";
    break;
  case NOOP:
    local_8 = "PSNodeType::NOOP";
    break;
  case MEMCPY:
    local_8 = "PSNodeType::MEMCPY";
    break;
  case NULL_ADDR:
    local_8 = "PSNodeType::NULL_ADDR";
    break;
  case UNKNOWN_MEM:
    local_8 = "PSNodeType::UNKNOWN_MEM";
    break;
  case INVALIDATED:
    local_8 = "PSNodeType::INVALIDATED";
    break;
  default:
    local_8 = "Unknown type";
  }
  return local_8;
}

Assistant:

inline const char *PSNodeTypeToCString(enum PSNodeType type) {
#define ELEM(t)                                                                \
    case t:                                                                    \
        do {                                                                   \
            return (#t);                                                       \
        } while (0);                                                           \
        break;
    switch (type) {
        ELEM(PSNodeType::ALLOC)
        ELEM(PSNodeType::LOAD)
        ELEM(PSNodeType::STORE)
        ELEM(PSNodeType::GEP)
        ELEM(PSNodeType::PHI)
        ELEM(PSNodeType::CAST)
        ELEM(PSNodeType::FUNCTION)
        ELEM(PSNodeType::CALL)
        ELEM(PSNodeType::CALL_FUNCPTR)
        ELEM(PSNodeType::CALL_RETURN)
        ELEM(PSNodeType::FORK)
        ELEM(PSNodeType::JOIN)
        ELEM(PSNodeType::ENTRY)
        ELEM(PSNodeType::RETURN)
        ELEM(PSNodeType::CONSTANT)
        ELEM(PSNodeType::NOOP)
        ELEM(PSNodeType::MEMCPY)
        ELEM(PSNodeType::NULL_ADDR)
        ELEM(PSNodeType::UNKNOWN_MEM)
        ELEM(PSNodeType::FREE)
        ELEM(PSNodeType::INVALIDATE_OBJECT)
        ELEM(PSNodeType::INVALIDATE_LOCALS)
        ELEM(PSNodeType::INVALIDATED)
    default:
        assert(0 && "unknown PointerGraph type");
        return "Unknown type";
    };
#undef ELEM
}